

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpacceptor.cpp
# Opt level: O2

int __thiscall
TCPAcceptor::accept(TCPAcceptor *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  int sd;
  TCPStream *this_00;
  socklen_t len;
  sockaddr_in address;
  
  if (this->m_listening == true) {
    len = 0x10;
    address.sin_family = 0;
    address.sin_port = 0;
    address.sin_addr.s_addr = 0;
    address.sin_zero[0] = '\0';
    address.sin_zero[1] = '\0';
    address.sin_zero[2] = '\0';
    address.sin_zero[3] = '\0';
    address.sin_zero[4] = '\0';
    address.sin_zero[5] = '\0';
    address.sin_zero[6] = '\0';
    address.sin_zero[7] = '\0';
    sd = ::accept(this->m_lsd,(sockaddr *)&address,&len);
    if (-1 < sd) {
      this_00 = (TCPStream *)operator_new(0x30);
      TCPStream::TCPStream(this_00,sd,&address);
      goto LAB_001059d7;
    }
    perror("accept() failed");
  }
  this_00 = (TCPStream *)0x0;
LAB_001059d7:
  return (int)this_00;
}

Assistant:

TCPStream* TCPAcceptor::accept()
{
    if (!m_listening) {
        return nullptr;
    }

    struct sockaddr_in address;
    socklen_t len = sizeof(address);
    memset(&address, 0, sizeof(address));
    int sd = ::accept(m_lsd, (struct sockaddr*)&address, &len);
    if (sd < 0) {
        perror("accept() failed");
        return nullptr;
    }
    return new TCPStream(sd, &address);
}